

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_core.hpp
# Opt level: O2

void __thiscall
asio::ssl::detail::stream_core::stream_core<asio::any_io_executor>
          (stream_core *this,SSL_CTX *context,any_io_executor *ex)

{
  pointer puVar1;
  size_t sVar2;
  pointer puVar3;
  time_point local_38;
  
  engine::engine(&this->engine_,context);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(&this->pending_read_,ex);
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(&this->pending_write_,ex);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->output_buffer_space_,0x4400,(allocator_type *)&local_38);
  puVar1 = (this->output_buffer_space_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(this->output_buffer_space_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  puVar3 = (pointer)0x0;
  if (sVar2 != 0) {
    puVar3 = puVar1;
  }
  (this->output_buffer_).data_ = puVar3;
  (this->output_buffer_).size_ = sVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->input_buffer_space_,0x4400,(allocator_type *)&local_38);
  puVar1 = (this->input_buffer_space_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(this->input_buffer_space_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  puVar3 = (pointer)0x0;
  if (sVar2 != 0) {
    puVar3 = puVar1;
  }
  (this->input_buffer_).data_ = puVar3;
  (this->input_buffer_).size_ = sVar2;
  (this->input_).data_ = (void *)0x0;
  (this->input_).size_ = 0;
  local_38.__d.__r = (duration)-0x8000000000000000;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(&this->pending_read_,&local_38);
  local_38.__d.__r = (duration)-0x8000000000000000;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(&this->pending_write_,&local_38);
  return;
}

Assistant:

stream_core(SSL_CTX* context, const Executor& ex)
    : engine_(context),
      pending_read_(ex),
      pending_write_(ex),
      output_buffer_space_(max_tls_record_size),
      output_buffer_(asio::buffer(output_buffer_space_)),
      input_buffer_space_(max_tls_record_size),
      input_buffer_(asio::buffer(input_buffer_space_))
  {
    pending_read_.expires_at(neg_infin());
    pending_write_.expires_at(neg_infin());
  }